

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleServer.cpp
# Opt level: O0

void __thiscall
CustomServer::on_message
          (CustomServer *this,shared_ptr<blcl::net::connection<MsgType>_> *client,
          message<MsgType> *msg)

{
  MsgType MVar1;
  message<MsgType> *msg_00;
  element_type *peVar2;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  shared_ptr<blcl::net::connection<MsgType>_> local_38;
  uint32_t local_24;
  message<MsgType> *local_20;
  message<MsgType> *msg_local;
  shared_ptr<blcl::net::connection<MsgType>_> *client_local;
  CustomServer *this_local;
  
  MVar1 = (msg->header).id;
  local_20 = msg;
  msg_local = (message<MsgType> *)client;
  client_local = (shared_ptr<blcl::net::connection<MsgType>_> *)this;
  if (MVar1 == ServerPing) {
    peVar2 = std::
             __shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)client);
    blcl::net::connection<MsgType>::send(peVar2,(int)local_20,__buf,in_RCX,in_R8D);
  }
  else if (MVar1 == MessageAll) {
    (msg->header).id = ServerMessage;
    peVar2 = std::
             __shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<blcl::net::connection<MsgType>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)client);
    local_24 = blcl::net::connection<MsgType>::get_id(peVar2);
    blcl::net::operator<<(msg,&local_24);
    msg_00 = local_20;
    std::shared_ptr<blcl::net::connection<MsgType>_>::shared_ptr(&local_38,client);
    blcl::net::server_interface<MsgType>::broadcast_message
              (&this->super_server_interface<MsgType>,msg_00,&local_38);
    std::shared_ptr<blcl::net::connection<MsgType>_>::~shared_ptr(&local_38);
  }
  return;
}

Assistant:

void on_message(std::shared_ptr<blcl::net::connection<MsgType>> client, blcl::net::message<MsgType>& msg) override {
        switch (msg.header.id) {
            case MsgType::ServerPing: {
                //std::cout << "[INFO] " << client->get_id() << ": Server Ping" << std::endl;
                client->send(msg);
                break;
            }
            case MsgType::MessageAll: {
               // std::cout << "[INFO] [" << std::chrono::system_clock::now().time_since_epoch().count() << "] " << client->get_id() << ": Broadcast\n";
//                blcl::net::message<MsgType> msg;
                msg.header.id = MsgType::ServerMessage;
                msg << client->get_id();
                broadcast_message(msg, client);
            }
        }
    }